

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O1

int yy_param(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *cclass;
  char *cclass_00;
  char *cclass_01;
  int iVar6;
  int yythunkpos0;
  int iVar7;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  iVar7 = 0;
  yyDo(G,yyPush,6,0,"yyPush");
  yyDo(G,yy_1_param,G->begin,G->end,"yy_1_param");
  iVar5 = G->pos;
  iVar6 = G->thunkpos;
  iVar3 = yy_ident(G);
  if (iVar3 != 0) {
    iVar7 = 0;
    yyDo(G,yySet,-6,0,"yySet");
    iVar3 = yy_ws(G);
    if (iVar3 != 0) {
      do {
        iVar5 = G->pos;
        iVar6 = G->thunkpos;
        iVar3 = yy_ws(G);
      } while (iVar3 != 0);
      iVar7 = 5;
      iVar3 = 0;
    }
  }
  G->pos = iVar5;
  G->thunkpos = iVar6;
  if ((iVar7 != 5) && (iVar7 != 0)) {
    return iVar3;
  }
  yyDo(G,yyPush,1,0,"yyPush");
  iVar5 = G->pos;
  iVar6 = G->thunkpos;
  iVar3 = yymatchChar(G,0x2a);
  if ((iVar3 == 0) || (iVar3 = yy_array_var(G), iVar3 == 0)) {
    G->pos = iVar5;
    G->thunkpos = iVar6;
    iVar5 = yy_term(G);
    if (iVar5 == 0) {
      G->pos = iVar1;
      G->thunkpos = iVar2;
      return 0;
    }
  }
  else {
    yyDo(G,yySet,-1,0,"yySet");
    yyDo(G,yy_1_param_term,G->begin,G->end,"yy_1_param_term");
  }
  yyDo(G,yyPop,1,0,"yyPop");
  yyDo(G,yySet,-5,0,"yySet");
  do {
    iVar1 = G->pos;
    iVar2 = G->thunkpos;
    do {
      iVar5 = G->pos;
      iVar6 = G->thunkpos;
      iVar3 = yy_ws(G);
    } while (iVar3 != 0);
    G->pos = iVar5;
    G->thunkpos = iVar6;
    yyDo(G,yyPush,1,0,"yyPush");
    iVar3 = yymatchChar(G,0x3d);
    if (iVar3 == 0) {
LAB_001080e5:
      G->pos = iVar5;
      G->thunkpos = iVar6;
      iVar5 = yymatchString(G,"is");
      iVar6 = 8;
      if ((iVar5 != 0) && (iVar5 = yy_ws(G), iVar5 != 0)) {
        do {
          iVar5 = G->pos;
          iVar6 = G->thunkpos;
          iVar3 = yy_ws(G);
        } while (iVar3 != 0);
        G->pos = iVar5;
        G->thunkpos = iVar6;
        iVar3 = yymatchString(G,"copy");
        if (iVar3 == 0) {
LAB_00108160:
          G->pos = iVar5;
          G->thunkpos = iVar6;
          iVar3 = yymatchString(G,"rw");
          if (iVar3 != 0) {
            iVar3 = G->pos;
            iVar7 = G->thunkpos;
            iVar4 = yymatchClass(G,(uchar *)"",cclass_00);
            if (iVar4 == 0) {
              G->pos = iVar3;
              G->thunkpos = iVar7;
              yyDo(G,yy_1_is_rw,G->begin,G->end,"yy_1_is_rw");
              iVar5 = -2;
              goto LAB_00108247;
            }
          }
          G->pos = iVar5;
          G->thunkpos = iVar6;
          iVar3 = yymatchString(G,"ref");
          if (iVar3 != 0) {
            iVar3 = G->pos;
            iVar7 = G->thunkpos;
            iVar4 = yymatchClass(G,(uchar *)"",cclass_01);
            if (iVar4 == 0) {
              G->pos = iVar3;
              G->thunkpos = iVar7;
              yyDo(G,yy_1_is_ref,G->begin,G->end,"yy_1_is_ref");
              iVar6 = 0;
              yyDo(G,yySet,-1,0,"yySet");
              goto LAB_0010829f;
            }
          }
          G->pos = iVar5;
          G->thunkpos = iVar6;
          iVar6 = 8;
        }
        else {
          iVar3 = G->pos;
          iVar7 = G->thunkpos;
          iVar4 = yymatchClass(G,(uchar *)"",cclass);
          if (iVar4 != 0) goto LAB_00108160;
          G->pos = iVar3;
          G->thunkpos = iVar7;
          yyDo(G,yy_1_is_copy,G->begin,G->end,"yy_1_is_copy");
          iVar5 = -3;
LAB_00108247:
          yyDo(G,yySet,iVar5,0,"yySet");
          iVar6 = 0xe;
        }
LAB_0010829f:
        if ((iVar6 == 0xe) || (iVar6 == 0)) {
          iVar6 = 0;
        }
      }
    }
    else {
      do {
        iVar3 = G->pos;
        iVar7 = G->thunkpos;
        iVar4 = yy_ws(G);
      } while (iVar4 != 0);
      G->pos = iVar3;
      G->thunkpos = iVar7;
      iVar4 = yy_loose_or_expr(G);
      if (iVar4 == 0) {
        G->pos = iVar3;
        G->thunkpos = iVar7;
        goto LAB_001080e5;
      }
      yyDo(G,yySet,-1,0,"yySet");
      yyDo(G,yy_1_param_defaults,G->begin,G->end,"yy_1_param_defaults");
      yyDo(G,yyPop,1,0,"yyPop");
      yyDo(G,yySet,-4,0,"yySet");
      iVar6 = 10;
    }
    if (iVar6 == 10) {
LAB_001082b8:
      iVar6 = 7;
    }
    else if (iVar6 == 8) {
      G->pos = iVar1;
      G->thunkpos = iVar2;
      iVar6 = 0;
    }
    else if (iVar6 == 0) goto LAB_001082b8;
    if (iVar6 == 0) {
      yyDo(G,yy_2_param,G->begin,G->end,"yy_2_param");
      yyDo(G,yyPop,6,0,"yyPop");
      return 1;
    }
  } while( true );
}

Assistant:

YY_RULE(int) yy_param(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyDo(G, yyPush, 6, 0, "yyPush");
  yyprintfv((stderr, "%s\n", "param"));
  yyDo(G, yy_1_param, G->begin, G->end, "yy_1_param");

  {  int yypos237= G->pos, yythunkpos237= G->thunkpos;  if (!yy_ident(G))  goto l237;
  yyDo(G, yySet, -6, 0, "yySet");
  if (!yy_ws(G))  goto l237;

  l239:;	
  {  int yypos240= G->pos, yythunkpos240= G->thunkpos;  if (!yy_ws(G))  goto l240;
  goto l239;
  l240:;	  G->pos= yypos240; G->thunkpos= yythunkpos240;
  }  goto l238;
  l237:;	  G->pos= yypos237; G->thunkpos= yythunkpos237;
  }
  l238:;	  if (!yy_param_term(G))  goto l236;
  yyDo(G, yySet, -5, 0, "yySet");

  l241:;	
  {  int yypos242= G->pos, yythunkpos242= G->thunkpos;  if (!yy__(G))  goto l242;

  {  int yypos243= G->pos, yythunkpos243= G->thunkpos;  if (!yy_param_defaults(G))  goto l244;
  yyDo(G, yySet, -4, 0, "yySet");
  goto l243;
  l244:;	  G->pos= yypos243; G->thunkpos= yythunkpos243;  if (!yymatchString(G, "is")) goto l242;
  if (!yy_ws(G))  goto l242;

  l245:;	
  {  int yypos246= G->pos, yythunkpos246= G->thunkpos;  if (!yy_ws(G))  goto l246;
  goto l245;
  l246:;	  G->pos= yypos246; G->thunkpos= yythunkpos246;
  }
  {  int yypos247= G->pos, yythunkpos247= G->thunkpos;  if (!yy_is_copy(G))  goto l248;
  yyDo(G, yySet, -3, 0, "yySet");
  goto l247;
  l248:;	  G->pos= yypos247; G->thunkpos= yythunkpos247;  if (!yy_is_rw(G))  goto l249;
  yyDo(G, yySet, -2, 0, "yySet");
  goto l247;
  l249:;	  G->pos= yypos247; G->thunkpos= yythunkpos247;  if (!yy_is_ref(G))  goto l242;
  yyDo(G, yySet, -1, 0, "yySet");

  }
  l247:;	
  }
  l243:;	  goto l241;
  l242:;	  G->pos= yypos242; G->thunkpos= yythunkpos242;
  }  yyDo(G, yy_2_param, G->begin, G->end, "yy_2_param");
  yyprintf((stderr, "  ok   param"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));
  yyDo(G, yyPop, 6, 0, "yyPop");
  return 1;
  l236:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "param"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}